

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_stroke_rect
               (nk_draw_list *list,nk_rect rect,nk_color col,float rounding,float thickness)

{
  float fVar1;
  float fVar2;
  nk_vec2 a;
  nk_vec2 b;
  float fVar3;
  float fVar4;
  
  if ((uint)col < 0x1000000 || list == (nk_draw_list *)0x0) {
    return;
  }
  fVar1 = rect.x;
  fVar2 = rect.y;
  fVar3 = fVar1;
  fVar4 = fVar2;
  if (list->line_AA != NK_ANTI_ALIASING_ON) {
    fVar3 = fVar1 + -0.5;
    fVar4 = fVar2 + -0.5;
  }
  a.y = fVar4;
  a.x = fVar3;
  b.y = fVar2 + rect.h;
  b.x = fVar1 + rect.w;
  nk_draw_list_path_rect_to(list,a,b,rounding);
  nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_rect(struct nk_draw_list *list, struct nk_rect rect,
struct nk_color col, float rounding, float thickness)
{
NK_ASSERT(list);
if (!list || !col.a) return;
if (list->line_AA == NK_ANTI_ALIASING_ON) {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x, rect.y),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} else {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x-0.5f, rect.y-0.5f),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} nk_draw_list_path_stroke(list,  col, NK_STROKE_CLOSED, thickness);
}